

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::parse_obj_prop
          (CTcParser *this,int *err,CTPNObjDef *objdef,int replace,CTcSymMetaclass *meta_sym,
          tcprs_term_info *term_info,propset_def *propset_stack,int propset_depth,int obj_is_nested,
          int is_inline)

{
  CTPNStm *__n;
  tc_toktyp_t tVar1;
  wchar_t wVar2;
  uint uVar3;
  tc_symtype_t tVar4;
  int iVar5;
  uint uVar6;
  CTcToken *pCVar7;
  char *pcVar8;
  char *pcVar9;
  CTcSymProp *pCVar10;
  CTPNAnonFunc *pCVar11;
  CTcPrsNode *pCVar12;
  CTcSymProp *pCVar13;
  size_t sVar14;
  uint in_ECX;
  CTPNObjDef *in_RDX;
  CTcSymProp *in_RSI;
  long in_RDI;
  CTcSymMetaclassBase *in_R8;
  CTcSymProp *in_R9;
  bool bVar15;
  CTPNCodeBody *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  CTcDictPropEntry *entry;
  CTcSymMetaProp *mprop;
  CTcSymMetaclass *cur_meta;
  CTPNObjProp *obj_prop;
  int is_dup;
  CTcPrsPropExprSave save_info;
  CTcSymObj *obj_sym;
  CTcConstVal cval;
  CTPNAnonFunc *inline_method;
  CTcPrsNode *expr;
  CTPNCodeBody *code_body_1;
  int is_vocab_prop;
  CTPNCodeBody *code_body;
  int has_retval;
  CTcSymLocal *varargs_list_local;
  int varargs_list;
  int varargs;
  int opt_argc;
  int argc;
  CTPNAnonFunc *m;
  CTcSymbol *sym;
  int op_args;
  CTcSymProp *prop_sym;
  size_t rem;
  utf8_ptr dst;
  utf8_ptr src;
  char tmpbuf [80];
  propset_def *cur;
  char expbuf [80];
  size_t explen;
  int i;
  CTcToken prop_tok;
  int is_static;
  CTPNObjProp *new_prop;
  CTcConstVal *in_stack_fffffffffffffc78;
  int iVar16;
  CTcTokenizer *in_stack_fffffffffffffc80;
  CTcTokenizer *in_stack_fffffffffffffc88;
  CTcTokenizer *in_stack_fffffffffffffc90;
  CTcTokenizer *in_stack_fffffffffffffc98;
  CTcSymObjBase *in_stack_fffffffffffffca0;
  int iVar17;
  int in_stack_fffffffffffffca8;
  undefined4 uVar18;
  int in_stack_fffffffffffffcac;
  CTcParser *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  CTPNObjDef *in_stack_fffffffffffffcc0;
  CTPNObjDef *this_00;
  undefined8 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  CTcParser *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffcf0;
  CTcSymObj *local_300;
  undefined8 in_stack_fffffffffffffd08;
  CTcConstVal *this_01;
  CTPNAnonFunc **in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  CTcPrsNode **in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  CTcParser *this_02;
  undefined1 *__dest;
  long *local_290;
  CTcSymMetaProp *local_288;
  CTcSymMetaclassBase *local_280;
  CTPNObjPropBase *local_278;
  int *in_stack_fffffffffffffdd8;
  int *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  CTcParser *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  long lVar19;
  CTcSymLocal **in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  long lVar20;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  CTcPrsSymtab *in_stack_fffffffffffffe58;
  tcprs_codebodytype in_stack_fffffffffffffe60;
  propset_def *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  CTcFormalTypeList **in_stack_fffffffffffffe80;
  CTcSymPropBase *local_168;
  utf8_ptr local_158;
  utf8_ptr local_150;
  char local_148 [88];
  CTcPrsNode *local_f0;
  undefined1 local_e8 [80];
  size_t local_98;
  int local_8c;
  undefined4 local_5c;
  CTPNObjPropBase *local_58;
  CTcSymProp *local_50;
  CTcSymMetaclassBase *local_48;
  uint local_3c;
  CTPNObjDef *local_38;
  CTcSymProp *local_30;
  
  local_58 = (CTPNObjPropBase *)0x0;
  local_5c = 0;
  local_50 = in_R9;
  local_48 = in_R8;
  local_3c = in_ECX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  pCVar7 = CTcTokenizer::copycur(in_stack_fffffffffffffc98);
  memcpy(&stack0xffffffffffffff78,pCVar7,0x28);
  iVar16 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  if (in_stack_00000010 != 0) {
    tVar1 = CTcToken::gettyp((CTcToken *)&stack0xffffffffffffff78);
    if (tVar1 == TOKT_OPERATOR) {
      CTcTokenizer::log_error(0x2bd6);
    }
    local_8c = in_stack_00000010;
    if (10 < in_stack_00000010) {
      local_8c = 10;
    }
    pCVar7 = CTcTokenizer::getcur(G_tok);
    local_98 = CTcToken::get_text_len(pCVar7);
    __dest = local_e8;
    pCVar7 = CTcTokenizer::getcur(G_tok);
    pcVar8 = CTcToken::get_text(pCVar7);
    memcpy(__dest,pcVar8,local_98);
    local_f0 = &(in_stack_00000008->super_CTPNCodeBodyBase).super_CTPNStmTop.super_CTPNStm.
                super_CTPNStmBase.super_CTcPrsNode + (long)(local_8c + -1) * 3;
    while( true ) {
      iVar16 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
      iVar5 = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
      if (local_8c < 1) break;
      utf8_ptr::utf8_ptr(&local_150);
      utf8_ptr::utf8_ptr(&local_158);
      iVar16 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
      iVar5 = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
      if (0x50 < (long)&((*(CTPNStm **)(local_f0 + 1))->super_CTPNStmBase).super_CTcPrsNode.
                        super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + local_98) {
        CTcTokenizer::log_error(0x2bb8);
        break;
      }
      utf8_ptr::set(&local_150,(char *)(local_f0->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase);
      utf8_ptr::set(&local_158,local_148);
      __n = *(CTPNStm **)(local_f0 + 1);
      while( true ) {
        bVar15 = false;
        if (__n != (CTPNStm *)0x0) {
          wVar2 = utf8_ptr::getch((utf8_ptr *)0x2c0e8b);
          bVar15 = wVar2 != L'*';
        }
        if (!bVar15) break;
        utf8_ptr::getch((utf8_ptr *)0x2c0eb2);
        utf8_ptr::setch((utf8_ptr *)in_stack_fffffffffffffc80,
                        (wchar_t)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffc90,(size_t *)in_stack_fffffffffffffc88);
      }
      if ((__n != (CTPNStm *)0x0) && (wVar2 = utf8_ptr::getch((utf8_ptr *)0x2c0ef0), wVar2 == L'*'))
      {
        utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffc90,(size_t *)in_stack_fffffffffffffc88);
      }
      pcVar8 = utf8_ptr::getptr(&local_158);
      memcpy(pcVar8,local_e8,local_98);
      pcVar8 = utf8_ptr::getptr(&local_158);
      utf8_ptr::set(&local_158,pcVar8 + local_98);
      if (__n != (CTPNStm *)0x0) {
        pcVar8 = utf8_ptr::getptr(&local_158);
        pcVar9 = utf8_ptr::getptr(&local_150);
        memcpy(pcVar8,pcVar9,(size_t)__n);
        pcVar8 = utf8_ptr::getptr(&local_158);
        utf8_ptr::set(&local_158,pcVar8 + (long)__n);
      }
      pcVar8 = utf8_ptr::getptr(&local_158);
      local_98 = (long)pcVar8 - (long)local_148;
      memcpy(local_e8,local_148,local_98);
      local_8c = local_8c + -1;
      local_f0 = local_f0 + -3;
    }
    pcVar8 = CTcTokenizer::store_source
                       (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                        (size_t)in_stack_fffffffffffffc80);
    CTcToken::set_text((CTcToken *)&stack0xffffffffffffff78,pcVar8,local_98);
  }
  local_168 = (CTcSymPropBase *)0x0;
  tVar1 = CTcToken::gettyp((CTcToken *)&stack0xffffffffffffff78);
  if (tVar1 == TOKT_OPERATOR) {
    parse_op_name(in_stack_fffffffffffffcb0,
                  (CTcToken *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                  (int *)in_stack_fffffffffffffca0);
  }
  this_02 = (CTcParser *)&stack0xffffffffffffff78;
  pcVar8 = CTcToken::get_text((CTcToken *)this_02);
  iVar17 = (int)pcVar8;
  CTcToken::get_text_len((CTcToken *)this_02);
  pCVar10 = (CTcSymProp *)
            CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_fffffffffffffc80,
                               (textchar_t *)in_stack_fffffffffffffc78,0x2c10fb);
  tVar1 = CTcTokenizer::next(in_stack_fffffffffffffc88);
  pCVar13 = (CTcSymProp *)(ulong)(tVar1 - TOKT_LPAR);
  switch(pCVar13) {
  case (CTcSymProp *)0x0:
  case (CTcSymProp *)0x4:
    goto LAB_002c1142;
  case (CTcSymProp *)0x1:
  case (CTcSymProp *)0x2:
  case (CTcSymProp *)0x5:
  case (CTcSymProp *)0x7:
  case (CTcSymProp *)0x17:
    sVar14 = CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffff78);
    uVar6 = (uint)sVar14;
    pcVar8 = CTcToken::get_text((CTcToken *)&stack0xffffffffffffff78);
    pCVar7 = CTcTokenizer::getcur(G_tok);
    sVar14 = CTcToken::get_text_len(pCVar7);
    uVar3 = (uint)sVar14;
    pCVar7 = CTcTokenizer::getcur(G_tok);
    pcVar9 = CTcToken::get_text(pCVar7);
    CTcTokenizer::log_error(0x2b64,(ulong)uVar6,pcVar8,(ulong)uVar3,pcVar9);
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2c140d);
    if (tVar1 != TOKT_SEM) {
      CTcTokenizer::next(in_stack_fffffffffffffc88);
    }
    break;
  default:
    CTcTokenizer::log_error_curtok
              (in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
LAB_002c1537:
    local_168 = &look_up_prop(in_stack_fffffffffffffce0,
                              (CTcToken *)
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),iVar5)->
                 super_CTcSymPropBase;
    in_stack_fffffffffffffd18 = in_stack_fffffffffffffd18 & 0xffffff;
    if (local_168 != (CTcSymPropBase *)0x0) {
      iVar5 = CTcSymPropBase::is_vocab(local_168);
      in_stack_fffffffffffffd18 = CONCAT13(iVar5 != 0,(int3)in_stack_fffffffffffffd18);
    }
    uVar6 = in_stack_fffffffffffffd18 >> 0x18;
    lVar20 = 0;
    lVar19 = 0;
    if ((uVar6 == 0) || (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2c15db), tVar1 != TOKT_SSTR)) {
      iVar5 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      if (uVar6 != 0) {
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffc80,iVar5);
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2c178d);
      if (tVar1 == TOKT_STATIC) {
        local_5c = 1;
        CTcTokenizer::next(in_stack_fffffffffffffc88);
      }
      begin_prop_expr((CTcParser *)in_stack_fffffffffffffc90,
                      (CTcPrsPropExprSave *)in_stack_fffffffffffffc88,
                      (int)((ulong)in_stack_fffffffffffffc80 >> 0x20),(int)in_stack_fffffffffffffc80
                     );
      pCVar12 = parse_expr_or_dstr((CTcParser *)in_stack_fffffffffffffc80,iVar5);
      if (pCVar12 == (CTcPrsNode *)0x0) {
        *(undefined4 *)
         &(local_30->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry = 1;
        return;
      }
      finish_prop_expr(this_02,(CTcPrsPropExprSave *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       in_stack_fffffffffffffd20,
                       (CTPNCodeBody **)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       in_stack_fffffffffffffd10,iVar16,iVar17,pCVar13);
    }
    else {
      this_01 = (CTcConstVal *)&stack0xfffffffffffffe10;
      CTcConstVal::CTcConstVal(this_01);
      CTcConstVal::set_vocab_list(this_01);
      pCVar12 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2c1610);
      CTPNConst::CTPNConst((CTPNConst *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      if (*(long *)(in_RDI + 0x130) == 0) {
        CTcTokenizer::log_error(0x2b7c);
      }
      if (local_38 == (CTPNObjDef *)0x0) {
        local_300 = (CTcSymObj *)0x0;
      }
      else {
        local_300 = CTPNObjDef::get_obj_sym(local_38);
      }
      do {
        if (local_300 != (CTcSymObj *)0x0) {
          pCVar7 = CTcTokenizer::getcur(G_tok);
          CTcToken::get_text(pCVar7);
          pCVar7 = CTcTokenizer::getcur(G_tok);
          CTcToken::get_text_len(pCVar7);
          CTcSymPropBase::get_prop(local_168);
          CTcSymObjBase::add_vocab_word
                    (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,
                     (size_t)in_stack_fffffffffffffc90,
                     (tctarg_prop_id_t)((ulong)in_stack_fffffffffffffc88 >> 0x30));
        }
        tVar1 = CTcTokenizer::next(in_stack_fffffffffffffc88);
      } while (tVar1 == TOKT_SSTR);
    }
    if (local_168 != (CTcSymPropBase *)0x0) {
      iVar5 = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
      if (lVar20 == 0) {
        if (lVar19 == 0) {
          if (pCVar12 != (CTcPrsNode *)0x0) {
            local_58 = &CTPNObjDef::add_prop
                                  (in_stack_fffffffffffffcc0,
                                   (CTcSymProp *)
                                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                                   (CTcPrsNode *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac
                                   ,in_stack_fffffffffffffca8)->super_CTPNObjPropBase;
          }
        }
        else {
          local_58 = &CTPNObjDef::add_inline_method
                                (in_stack_fffffffffffffcc0,
                                 (CTcSymProp *)
                                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                                 (CTPNAnonFunc *)in_stack_fffffffffffffcb0,
                                 (CTcPrsNode *)
                                 CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),iVar5
                                )->super_CTPNObjPropBase;
        }
      }
      else {
        local_58 = &CTPNObjDef::add_method
                              (in_stack_fffffffffffffcc0,
                               (CTcSymProp *)
                               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                               (CTPNCodeBody *)in_stack_fffffffffffffcb0,
                               (CTcPrsNode *)
                               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),iVar5)
                    ->super_CTPNObjPropBase;
      }
    }
    break;
  case (CTcSymProp *)0x8:
    CTcTokenizer::next(in_stack_fffffffffffffc88);
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2c150b);
    if (tVar1 != TOKT_LBRACE) goto LAB_002c1537;
    CTcTokenizer::log_error(0x2b20);
LAB_002c1142:
    iVar17 = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
    iVar16 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    local_168 = &look_up_prop(in_stack_fffffffffffffce0,
                              (CTcToken *)
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),iVar5)->
                 super_CTcSymPropBase;
    if ((local_168 != (CTcSymPropBase *)0x0) &&
       (iVar5 = CTcSymPropBase::is_vocab(local_168), iVar5 != 0)) {
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffc80,iVar16);
    }
    if (in_stack_00000020 == 0) {
      iVar5 = 0;
      uVar18 = 0;
      this_00 = (CTPNObjDef *)0x0;
      parse_code_body(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
                      in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                      in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
                      in_stack_fffffffffffffe48,
                      (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe70,
                      (CTcCodeBodyRef *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      in_stack_fffffffffffffe80);
      if (*(int *)&(local_30->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                   super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry != 0) {
        return;
      }
      if (local_168 != (CTcSymPropBase *)0x0) {
        local_58 = &CTPNObjDef::add_method
                              (this_00,(CTcSymProp *)
                                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_00000010),
                               in_stack_00000008,
                               (CTcPrsNode *)CONCAT44(in_stack_fffffffffffffcac,uVar18),iVar5)->
                    super_CTPNObjPropBase;
      }
    }
    else {
      CTcTokenizer::unget((CTcTokenizer *)0x2c11ae);
      pCVar11 = CTcPrsOpUnary::parse_anon_func
                          ((int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                           (int)in_stack_fffffffffffffcf0);
      if (pCVar11 != (CTPNAnonFunc *)0x0) {
        local_58 = &CTPNObjDef::add_inline_method
                              (in_stack_fffffffffffffcc0,
                               (CTcSymProp *)
                               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                               (CTPNAnonFunc *)in_stack_fffffffffffffcb0,
                               (CTcPrsNode *)
                               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),iVar17)
                    ->super_CTPNObjPropBase;
      }
    }
    break;
  case (CTcSymProp *)0x16:
    if ((pCVar10 != (CTcSymProp *)0x0) &&
       (tVar4 = CTcSymbolBase::get_type((CTcSymbolBase *)pCVar10), tVar4 == TC_SYM_OBJ)) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)
                                  (local_50->super_CTcSymPropBase).super_CTcSymbol.
                                  super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                                  _vptr_CVmHashEntry,
                         (long)(local_50->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                               super_CVmHashEntryCS.super_CVmHashEntry.nxt_,TC_SEV_ERROR,0x2baf);
      CTcTokenizer::unget((CTcTokenizer *)0x2c1485);
      *(undefined4 *)
       &(local_50->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry.str_ = 1;
      return;
    }
    CTcTokenizer::next(in_stack_fffffffffffffc88);
    iVar5 = (*local_38->_vptr_CTPNObjDef[1])
                      (local_38,&stack0xffffffffffffffa8,local_30,local_50,&stack0xffffffffffffff78,
                       (ulong)local_3c);
    if (iVar5 == 0) {
      return;
    }
  }
  if (pCVar10 != (CTcSymProp *)0x0) {
    bVar15 = false;
    if ((in_stack_00000018 != 0) && (pCVar10 == *(CTcSymProp **)(in_RDI + 0xb8))) {
      bVar15 = true;
    }
    if (!bVar15) {
      for (local_278 = &CTPNObjDef::get_first_prop(local_38)->super_CTPNObjPropBase;
          local_278 != (CTPNObjPropBase *)0x0;
          local_278 = &CTPNObjPropBase::get_next_prop(local_278)->super_CTPNObjPropBase) {
        if ((local_278 != local_58) &&
           (pCVar13 = CTPNObjPropBase::get_prop_sym(local_278), pCVar13 == pCVar10)) {
          iVar5 = CTPNObjPropBase::is_overwritable(local_278);
          if (iVar5 == 0) {
            bVar15 = true;
          }
          else {
            pCVar10 = CTPNObjPropBase::get_prop_sym(local_278);
            (*local_38->_vptr_CTPNObjDef[2])(local_38,pCVar10);
          }
          break;
        }
      }
    }
    if (bVar15) {
      sVar14 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2c1a53);
      uVar6 = (uint)sVar14;
      pcVar8 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2c1a64);
      CTcTokenizer::log_error(0x2b6c,(ulong)uVar6,pcVar8);
    }
  }
  if ((local_48 != (CTcSymMetaclassBase *)0x0) && (local_168 != (CTcSymPropBase *)0x0)) {
    for (local_280 = local_48; local_280 != (CTcSymMetaclassBase *)0x0;
        local_280 = &CTcSymMetaclassBase::get_super_meta(local_280)->super_CTcSymMetaclassBase) {
      for (local_288 = CTcSymMetaclassBase::get_prop_head(local_280);
          local_288 != (CTcSymMetaProp *)0x0; local_288 = local_288->nxt_) {
        if (&local_288->prop_->super_CTcSymPropBase == local_168) {
          sVar14 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2c1af8);
          pcVar8 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2c1b0a);
          CTcTokenizer::log_error(0x2d17,sVar14,pcVar8);
          break;
        }
      }
    }
  }
  if ((local_168 != (CTcSymPropBase *)0x0) &&
     (iVar5 = CTcSymPropBase::is_vocab(local_168), iVar5 != 0)) {
    for (local_290 = *(long **)(in_RDI + 0x170); local_290 != (long *)0x0;
        local_290 = (long *)local_290[1]) {
      if ((CTcSymPropBase *)*local_290 == local_168) {
        *(byte *)(local_290 + 2) = *(byte *)(local_290 + 2) & 0xfe | 1;
        return;
      }
    }
  }
  return;
}

Assistant:

void CTcParser::parse_obj_prop(
    int *err, CTPNObjDef *objdef, int replace, CTcSymMetaclass *meta_sym,
    tcprs_term_info *term_info, propset_def *propset_stack, int propset_depth,
    int obj_is_nested, int is_inline)
{
    /* we haven't created the new property yet */
    CTPNObjProp *new_prop = 0;

    /* presume it's not a static property definition */
    int is_static = FALSE;
    
    /* remember the property token */
    CTcToken prop_tok = *G_tok->copycur();

    /* 
     *   if we're in a property set, apply the property set pattern to the
     *   property name 
     */
    if (propset_depth != 0)
    {
        /* we can't define operator overloads here */
        if (prop_tok.gettyp() == TOKT_OPERATOR)
            G_tok->log_error(TCERR_OPER_IN_PROPSET);
        
        /*
         *   Build the real property name based on all enclosing propertyset
         *   pattern strings.  Start with the current (innermost) pattern,
         *   then apply the next pattern out, and so on.
         *   
         *   Note that if the current nesting depth is greater than the
         *   maximum nesting depth, ignore the illegally deep levels and
         *   just start with the deepest legal level.  
         */
        int i = propset_depth;
		if (i > (int)MAX_PROPSET_DEPTH)
            i = MAX_PROPSET_DEPTH;
        
        /* start with the current token */
        size_t explen = G_tok->getcur()->get_text_len();
        char expbuf[TOK_SYM_MAX_LEN];
        memcpy(expbuf, G_tok->getcur()->get_text(), explen);
        
        /* iterate through the propertyset stack */
        for (propset_def *cur = &propset_stack[i-1] ; i > 0 ; --i, --cur)
        {
            char tmpbuf[TOK_SYM_MAX_LEN];
            utf8_ptr src;
            utf8_ptr dst;
            size_t rem;

            /* if we'd exceed the maximum token length, stop here */
            if (explen + cur->prop_pattern_len > TOK_SYM_MAX_LEN)
            {
                /* complain about it */
                G_tok->log_error(TCERR_PROPSET_TOK_TOO_LONG);
                
                /* stop the expansion */
                break;
            }
            
            /* copy the pattern up to the '*' */
            for (src.set((char *)cur->prop_pattern),
                 dst.set(tmpbuf), rem = cur->prop_pattern_len ;
                 rem != 0 && src.getch() != '*' ; src.inc(&rem))
            {
                /* copy this character */
                dst.setch(src.getch());
            }
            
            /* if we found a '*', skip it */
            if (rem != 0 && src.getch() == '*')
                src.inc(&rem);
            
            /* insert the expansion from the last round here */
            memcpy(dst.getptr(), expbuf, explen);
            
            /* advance our output pointer */
            dst.set(dst.getptr() + explen);
            
            /* copy the remainder of the pattern string */
            if (rem != 0)
            {
                /* copy the remaining bytes */
                memcpy(dst.getptr(), src.getptr(), rem);

                /* advance the output pointer past the copied bytes */
                dst.set(dst.getptr() + rem);
            }
            
            /* copy the result back to the expansion buffer */
            explen = dst.getptr() - tmpbuf;
            memcpy(expbuf, tmpbuf, explen);
        }

        /* store the new token in tokenizer memory */
        prop_tok.set_text(G_tok->store_source(expbuf, explen), explen);
    }

    /* presume we won't find a valid symbol for the property token */
    CTcSymProp *prop_sym = 0;

    /* presume it's not an operator overload property */
    int op_args = 0;

    /* if this is an 'operator' property, the syntax is special */
    if (prop_tok.gettyp() == TOKT_OPERATOR)
        parse_op_name(&prop_tok, &op_args);

    /* 
     *   look up the property token as a symbol, to see if it's already
     *   defined - we don't want to presume it's a property quite yet, but
     *   we can at least look to see if it's defined as something else 
     */
    CTcSymbol *sym = global_symtab_->find(
        prop_tok.get_text(), prop_tok.get_text_len());

    /* skip it and see what comes next */
    switch (G_tok->next())
    {
    case TOKT_LPAR:
    case TOKT_LBRACE:
    parse_method:
        /* look up the symbol */
        prop_sym = look_up_prop(&prop_tok, TRUE);

        /* vocabulary properties can't be code */
        if (prop_sym != 0 && prop_sym->is_vocab())
            G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);

        /* 
         *   A left paren starts a formal parameter list, a left brace starts
         *   a code body - in either case, we have a method, so parse the
         *   code body.  If we're parsing an inline object definition, parse
         *   it as an anonymous method definition instead.
         */
        if (is_inline)
        {
            /* inline object - parse an anonymous method */
            G_tok->unget();
            CTPNAnonFunc *m = CTcPrsOpUnary::parse_anon_func(FALSE, TRUE);

            /* add this as a property expression */
            if (m != 0)
                new_prop = objdef->add_inline_method(prop_sym, m, 0, replace);
        }
        else
        {
            /* top-level object - parse a code body */
            int argc;
            int opt_argc;
            int varargs;
            int varargs_list;
            CTcSymLocal *varargs_list_local;
            int has_retval;
            CTPNCodeBody *code_body = parse_code_body(
                FALSE, TRUE, TRUE, &argc, &opt_argc, &varargs,
                &varargs_list, &varargs_list_local, &has_retval, err, 0,
                TCPRS_CB_NORMAL, propset_stack, propset_depth, 0, 0);

            /* check for errors in the code body */
            if (*err)
                return;

            /* 
             *   if this is an operator, check arguments, and pick the
             *   correct operator for the number of operands for operators
             *   with multiple operand numbers 
             */
            if (op_args != 0)
            {
                /* mark the code body as an operator overload method */
                if (code_body != 0)
                    code_body->set_operator_overload(TRUE);
                
                /* varargs aren't allowed */
                if (varargs)
                {
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
                else if (argc != op_args - 1)
                {
                    /* not a valid combination of operator and arguments */
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
            }
            
            /* add the method definition */
            if (prop_sym != 0)
                new_prop = objdef->add_method(prop_sym, code_body, 0, replace);
        }
        break;

    case TOKT_SEM:
    case TOKT_RBRACE:
    case TOKT_RPAR:
    case TOKT_RBRACK:
    case TOKT_COMMA:
        /* log the error */
        G_tok->log_error(TCERR_OBJDEF_REQ_PROPVAL,
                         (int)prop_tok.get_text_len(), prop_tok.get_text(),
                         (int)G_tok->getcur()->get_text_len(),
                         G_tok->getcur()->get_text());

        /* if it's anything other than a semicolon, skip it */
        if (G_tok->cur() != TOKT_SEM)
            G_tok->next();
        break;

    case TOKT_COLON:
        /*
         *   It's a nested object definition.  The value of the property is a
         *   reference to an anonymous object defined in-line after the
         *   colon.  The in-line object definition uses the "braces" version
         *   of the standard syntax: after the colon we have the class list,
         *   an open brace, the property list, and a close brace.
         *   
         *   Note that we hold off defining the property symbol for as long
         *   as possible, since we want to make sure that we don't have a
         *   syntax error where this was intended to be a whole new top-level
         *   object definition, but the terminator was accidentally left off
         *   the previous object.  In this case, the new object definition
         *   would look like a nested object rather than a new top-level
         *   object.  This is probably the case if the symbol before the
         *   colon is already known as an object name.
         */
        {
            /* 
             *   If the symbol before the colon is already known as an object
             *   name, it must be intended as a new object rather than a
             *   nested object, meaning that the terminator is missing from
             *   the previous object definition.  If this is the case, flag
             *   the termination error and proceed to parse the new object
             *   definition.  
             */
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* 
                 *   flag the unterminated object error - note that the
                 *   location where termination should have occurred is
                 *   where the caller tells us 
                 */
                G_tcmain->log_error(term_info->desc_, term_info->linenum_,
                                    TC_SEV_ERROR, TCERR_UNTERM_OBJ_DEF);

                /* unget the colon so we can parse the new object def */
                G_tok->unget();

                /* flag the termination error for the caller */
                term_info->unterm_ = TRUE;

                /* we're done */
                return;
            }

            /* skip the colon */
            G_tok->next();

            /* parse the nested object property */
            if (!objdef->parse_nested_obj_prop(
                new_prop, err, term_info, &prop_tok, replace))
                return;
        }
        
        /* done */
        break;

    case TOKT_EQ:
        /* skip the '=' */
        G_tok->next();

        /* 
         *   if a brace follows, this must be using the obsolete TADS 2
         *   notation, in which an equals sign followed a property name even
         *   if a method was being defined; if this is the case, generate an
         *   error, but then proceed to treat what follows as a method 
         */
        if (G_tok->cur() == TOKT_LBRACE)
        {
            /* log the error... */
            G_tok->log_error(TCERR_EQ_WITH_METHOD_OBSOLETE);

            /* ...but then go ahead and parse it as a method anyway */
            goto parse_method;
        }

        /* go parse the value */
        goto parse_value;

    default:
        /* 
         *   an '=' is required after a value property name; log the error
         *   and proceed, assuming that the '=' was left out but that the
         *   property value is otherwise well-formed 
         */
        G_tok->log_error_curtok(TCERR_PROP_REQ_EQ);

    parse_value:
        {
            /* look up the property symbol */
            prop_sym = look_up_prop(&prop_tok, TRUE);

            /* note if it's a vocabulary property */
            int is_vocab_prop = (prop_sym != 0 && prop_sym->is_vocab());

            /* we don't know whether we have a constant or method yet */
            CTPNCodeBody *code_body = 0;
            CTcPrsNode *expr = 0;
            CTPNAnonFunc *inline_method = 0;

            /* 
             *   if this is a vocabulary property, perform special vocabulary
             *   list parsing - a vocabulary property can have one or more
             *   single-quoted strings that we store in a list, but the list
             *   does not have to be enclosed in brackets 
             */
            if (is_vocab_prop && G_tok->cur() == TOKT_SSTR)
            {
                /* 
                 *   set the property to a vocab list placeholder for now in
                 *   the object - we'll replace it during linking with the
                 *   actual vocabulary list
                 */
                CTcConstVal cval;
                cval.set_vocab_list();
                expr = new CTPNConst(&cval);
                
                /* if I have no dictionary, it's an error */
                if (dict_cur_ == 0)
                    G_tok->log_error(TCERR_VOCAB_NO_DICT);
                
                /* get the object symbol */
                CTcSymObj *obj_sym = (objdef != 0 ? objdef->get_obj_sym() : 0);
                
                /* parse the list entries */
                for (;;)
                {
                    /* add the word to our vocabulary list */
                    if (obj_sym != 0)
                        obj_sym->add_vocab_word(
                            G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            prop_sym->get_prop());
                    
                    /* 
                     *   skip the string; if another string doesn't
                     *   immediately follow, we're done with the implied list
                     *   
                     */
                    if (G_tok->next() != TOKT_SSTR)
                        break;
                }
            }
            else
            {
                /* if it's a vocabulary property, other types aren't allowed */
                if (is_vocab_prop)
                    G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);
                
                /* check for the 'static' keyword */
                if (G_tok->cur() == TOKT_STATIC)
                {
                    /* note that it's static */
                    is_static = TRUE;

                    /* skip the 'static' keyword */
                    G_tok->next();
                }
                
                /* prepare to parse the property value expression */
                CTcPrsPropExprSave save_info;
                begin_prop_expr(&save_info, is_static, is_inline);
                
                /* 
                 *   parse the expression (which can be a double-quoted
                 *   string instead of a value expression) 
                 */
                expr = parse_expr_or_dstr(TRUE);
                if (expr == 0)
                {
                    *err = TRUE;
                    return;
                }
                
                /* 
                 *   finish the expression, and check to see if it needs
                 *   dynamic evaluation (if so, it will yield a code body)
                 */
                finish_prop_expr(
                    &save_info, expr, code_body, inline_method,
                    is_static, is_inline, prop_sym);
            }

            /* if we have a valid property and expression, add it */
            if (prop_sym != 0)
            {
                /* add the expression or code body, as appropriate */
                if (code_body != 0)
                {
                    /* method */
                    new_prop = objdef->add_method(
                        prop_sym, code_body, expr, replace);
                }
                else if (inline_method != 0)
                {
                    /* inline method */
                    new_prop = objdef->add_inline_method(
                        prop_sym, inline_method, expr, replace);
                }
                else if (expr != 0)
                {
                    /* constant expression */
                    new_prop = objdef->add_prop(
                        prop_sym, expr, replace, is_static);
                }
            }
        }
        
        /* done with the property */
        break;
    }

    /* make sure that the object doesn't already define this propery */
    if (sym != 0)
    {
        /* presume it's not a duplicate */
        int is_dup = FALSE;

        /* 
         *   if the enclosing object is nested, and this is the lexicalParent
         *   property, then it's defined automatically by the compiler and
         *   thus can't be redefined explicitly 
         */
        if (obj_is_nested && sym == lexical_parent_sym_)
            is_dup = TRUE;

        /* if we didn't already find a duplicate, scan the existing list */
        if (!is_dup)
        {
            /* scan the property list for this object */
            for (CTPNObjProp *obj_prop = objdef->get_first_prop() ;
                 obj_prop != 0 ; obj_prop = obj_prop->get_next_prop())
            {
                /* 
                 *   if it matches (and it's not the one we just added), log
                 *   an error 
                 */
                if (obj_prop != new_prop && obj_prop->get_prop_sym() == sym)
                {
                    /* 
                     *   if this property is overwritable, we're allowed to
                     *   replace it with a new value; otherwise, it's an
                     *   illegal duplicate 
                     */
                    if (obj_prop->is_overwritable())
                    {
                        /* 
                         *   we're allowed to overwrite it with an explicit
                         *   redefinition; simply remove the old property
                         *   from the list so we can add the new one 
                         */
                        objdef->delete_property(obj_prop->get_prop_sym());
                    }
                    else
                    {
                        /* note that we found a duplicate property */
                        is_dup = TRUE;
                    }

                    /* no need to continue looking */
                    break;
                }
            }
        }

        /* if we found a duplicate, log an error */
        if (is_dup)
            G_tok->log_error(TCERR_PROP_REDEF_IN_OBJ,
                             (int)sym->get_sym_len(), sym->get_sym());
    }

    /* 
     *   if we're modifying an intrinsic class, make sure the property isn't
     *   defined in the class's native interface 
     */
    if (meta_sym != 0 && prop_sym != 0)
    {
        /* check this intrinsic class and all of its superclasses */
        for (CTcSymMetaclass *cur_meta = meta_sym ; cur_meta != 0 ;
             cur_meta = cur_meta->get_super_meta())
        {
            /* scan the list of native methods */
            for (CTcSymMetaProp *mprop = cur_meta->get_prop_head() ;
                 mprop != 0 ; mprop = mprop->nxt_)
            {
                /* if it matches, flag an error */
                if (mprop->prop_ == prop_sym)
                {
                    /* log the error */
                    G_tok->log_error(TCERR_CANNOT_MOD_META_PROP,
                                     prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }

    /* 
     *   if this is a dictionary property, note that it's been defined for
     *   this object 
     */
    if (prop_sym != 0 && prop_sym->is_vocab())
    {
        /* scan the list of dictionary properties for this one */
        for (CTcDictPropEntry *entry = dict_prop_head_ ; entry != 0 ;
             entry = entry->nxt_)
        {
            /* check this one for a match */
            if (entry->prop_ == prop_sym)
            {
                /* mark this entry as defined for this object */
                entry->defined_ = TRUE;

                /* no need to look any further */
                break;
            }
        }
    }
}